

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O3

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t uVar11;
  ulong uVar12;
  _Bool _Var13;
  
  iVar4 = run_container_cardinality(container1);
  iVar5 = container2->cardinality;
  if (iVar5 == -1) {
    iVar5 = bitset_container_compute_cardinality(container2);
  }
  if (iVar5 == iVar4) {
    uVar7 = (ulong)container1->n_runs;
    if ((long)uVar7 < 1) {
      _Var13 = true;
    }
    else {
      uVar8 = 0;
      do {
        uVar1 = container1->runs[uVar8].value;
        uVar2 = container1->runs[uVar8].length;
        if (uVar2 == 0) {
          if ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_0011c908;
        }
        else {
          uVar6 = (uint)uVar2 + (uint)uVar1 + 1;
          puVar3 = container2->words;
          uVar9 = (ulong)(uVar1 >> 6);
          uVar12 = -1L << ((byte)uVar1 & 0x3f);
          uVar10 = -1L << ((byte)uVar6 & 0x3f);
          uVar6 = uVar6 >> 6;
          if (uVar1 >> 6 == uVar6) {
            if ((uVar12 & ~(puVar3[uVar9] | uVar10)) != 0) goto LAB_0011c908;
          }
          else {
            if (puVar3[uVar9] < uVar12) goto LAB_0011c908;
            if ((uint)uVar2 + (uint)uVar1 < 0xffff) {
              uVar11 = uVar10 | puVar3[uVar6];
              goto joined_r0x0011c8e9;
            }
            while ((uVar9 < 0x3ff && (uVar9 + 1 < (ulong)uVar6))) {
              uVar11 = puVar3[uVar9 + 1];
              uVar9 = uVar9 + 1;
joined_r0x0011c8e9:
              if (uVar11 != 0xffffffffffffffff) goto LAB_0011c908;
            }
          }
        }
        uVar8 = uVar8 + 1;
        _Var13 = uVar7 <= uVar8;
      } while (uVar8 != uVar7);
    }
  }
  else {
LAB_0011c908:
    _Var13 = false;
  }
  return _Var13;
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {
    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)
                          ? container2->cardinality
                          : bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}